

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall
DomPropertyToolTip::write(DomPropertyToolTip *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QString local_38;
  long local_20;
  
  aVar3._4_4_ = in_register_00000034;
  aVar3._0_4_ = __fd;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = L"propertytooltip";
    local_38.d.size = 0xf;
  }
  else {
    QString::toLower_helper(&local_38);
  }
  QVar6.m_size = (size_t)local_38.d.ptr;
  QVar6.field_0.m_data = aVar3.m_data;
  QXmlStreamWriter::writeStartElement(QVar6);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_name == true) {
    pQVar1 = &((this->m_attr_name).d.d)->super_QArrayData;
    pcVar2 = (this->m_attr_name).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar5.m_size = (size_t)pcVar2;
      QVar5.field_0.m_data = (void *)0x8000000000000004;
      QVar8.m_size = (size_t)L"name";
      QVar8.field_0.m_data = aVar3.m_data;
      QXmlStreamWriter::writeAttribute(QVar8,QVar5);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar4.m_size = (size_t)pcVar2;
      QVar4.field_0.m_data = (void *)0x8000000000000004;
      QVar7.m_size = (size_t)L"name";
      QVar7.field_0.m_data = aVar3.m_data;
      QXmlStreamWriter::writeAttribute(QVar7,QVar4);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomPropertyToolTip::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("propertytooltip") : tagName.toLower());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    writer.writeEndElement();
}